

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

vector<xmrig::String,_std::allocator<xmrig::String>_> * __thiscall
xmrig::String::split(String *this,char sep)

{
  char in_DL;
  vector<xmrig::String,_std::allocator<xmrig::String>_> *in_RSI;
  vector<xmrig::String,_std::allocator<xmrig::String>_> *in_RDI;
  size_t pos;
  size_t start;
  vector<xmrig::String,_std::allocator<xmrig::String>_> *out;
  vector<xmrig::String,_std::allocator<xmrig::String>_> *__args;
  pointer local_28;
  pointer local_20;
  
  __args = in_RDI;
  std::vector<xmrig::String,_std::allocator<xmrig::String>_>::vector
            ((vector<xmrig::String,_std::allocator<xmrig::String>_> *)0x1d66f5);
  if ((in_RSI->super__Vector_base<xmrig::String,_std::allocator<xmrig::String>_>)._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    local_20 = (pointer)0x0;
    for (local_28 = (pointer)0x0;
        local_28 <
        (in_RSI->super__Vector_base<xmrig::String,_std::allocator<xmrig::String>_>)._M_impl.
        super__Vector_impl_data._M_finish; local_28 = (pointer)((long)&local_28->m_data + 1)) {
      if (*(char *)((long)&local_28->m_data +
                   (long)(in_RSI->super__Vector_base<xmrig::String,_std::allocator<xmrig::String>_>)
                         ._M_impl.super__Vector_impl_data._M_start) == in_DL) {
        if (local_28 != local_20) {
          std::vector<xmrig::String,std::allocator<xmrig::String>>::
          emplace_back<char*,unsigned_long>(in_RSI,(char **)__args,(unsigned_long *)in_RDI);
        }
        local_20 = (pointer)((long)&local_28->m_data + 1);
      }
    }
    if (local_28 != local_20) {
      std::vector<xmrig::String,std::allocator<xmrig::String>>::emplace_back<char*,unsigned_long>
                (in_RSI,(char **)__args,(unsigned_long *)in_RDI);
    }
  }
  return __args;
}

Assistant:

std::vector<xmrig::String> xmrig::String::split(char sep) const
{
    std::vector<xmrig::String> out;
    if (m_size == 0) {
        return out;
    }

    size_t start = 0;
    size_t pos   = 0;

    for (pos = 0; pos < m_size; ++pos) {
        if (m_data[pos] == sep) {
            if ((pos - start) > 0) {
                out.emplace_back(m_data + start, pos - start);
            }

            start = pos + 1;
        }
    }

    if ((pos - start) > 0) {
        out.emplace_back(m_data + start, pos - start);
    }

    return out;
}